

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_pressure.cpp
# Opt level: O3

void __thiscall
spvtools::opt::RegisterLiveness::SimulateFission
          (RegisterLiveness *this,Loop *loop,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *moved_inst,
          unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
          *copied_inst,RegionRegisterLiveness *l1_sim_result,RegionRegisterLiveness *l2_sim_result)

{
  RegionRegisterLivenessMap *this_00;
  LiveSet *pLVar1;
  uint32_t blk_id;
  Op opcode;
  IRContext *this_01;
  Instruction *pIVar2;
  pointer pOVar3;
  uint **ppuVar4;
  anon_class_24_3_72e690ea predicate;
  anon_class_24_3_72e690ea predicate_00;
  anon_class_24_3_72e690ea predicate_01;
  anon_class_24_3_72e690ea predicate_02;
  type tVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int32_t iVar9;
  RegionRegisterLiveness *pRVar10;
  const_iterator cVar11;
  const_iterator cVar12;
  type tVar13;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *puVar14;
  __node_type *end;
  uint **ppuVar15;
  __hashtable *__h_5;
  _Hash_node_base *p_Var16;
  type tVar17;
  Instruction *pIVar18;
  anon_class_8_1_5b1a6210_for_predicate_ predicate_03;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Var19;
  ulong uVar20;
  __hashtable *__h_3;
  type tVar21;
  pointer pOVar22;
  ulong uVar23;
  ulong uVar24;
  __hashtable *__h_7;
  __hashtable *__h_2;
  __hashtable *__h;
  __node_gen_type __node_gen_2;
  size_t l2_reg_count;
  size_t l1_reg_count;
  __node_gen_type __node_gen;
  Range live_loop;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  exit_blocks;
  type local_200;
  ulong local_1f8;
  code *local_1f0;
  code *local_1e8;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_1e0;
  RegisterLiveness *local_1d8;
  type local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  type local_1b8;
  type tStack_1b0;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 auStack_188 [2];
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_178;
  __node_type *local_170;
  type local_168;
  BasicBlock *local_160;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
  local_158;
  ulong local_150;
  type local_148;
  __node_base local_140;
  type local_138;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  type local_110;
  ulong local_108;
  long *local_e8;
  undefined8 local_e0;
  code *local_d8;
  code *local_d0;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_c8;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Stack_c0;
  Loop *local_b8;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_b0;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Stack_a8;
  Loop *local_a0;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_98;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *p_Stack_90;
  Loop *local_88;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *local_80;
  unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
  *puStack_78;
  Loop *local_70;
  type local_68;
  type tStack_60;
  _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  puVar14 = copied_inst;
  predicate_03.moved_inst = &l1_sim_result->live_in_;
  RegionRegisterLiveness::Clear(l1_sim_result);
  RegionRegisterLiveness::Clear(l2_sim_result);
  local_1d8 = this;
  pRVar10 = Get(this,loop->loop_header_);
  local_68 = (type)0x0;
  predicate.copied_inst = copied_inst;
  predicate.moved_inst = moved_inst;
  predicate.loop = loop;
  local_1e0 = &copied_inst->_M_h;
  local_80 = moved_inst;
  puStack_78 = copied_inst;
  local_70 = loop;
  MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            ((Range *)&local_138.__align,(opt *)(pRVar10->live_in_)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_68.__align,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)puVar14,predicate);
  tVar13 = local_110;
  local_48 = local_118;
  tVar21._4_4_ = uStack_12c;
  tVar21._0_4_ = uStack_130;
  local_58 = local_128;
  uStack_50 = uStack_120;
  local_68 = local_138;
  uVar20 = local_108 ^ (ulong)tVar21;
  local_1b8 = (type)l1_sim_result;
  tStack_60 = tVar21;
  if (local_138 != local_110 || uVar20 != 0) {
    tVar17 = local_138;
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)l1_sim_result,(Instruction **)((long)tVar17 + 8),&local_1b8);
      if (tVar17 != tVar21) {
        do {
          tVar17.__data = *tVar17.__data;
          local_68 = tVar17;
          bVar6 = FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
                  ::IsPredicateSatisfied
                            ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                              *)&local_68.__align);
        } while (!bVar6);
      }
    } while (tVar17 != tVar13 || uVar20 != 0);
  }
  MakeFilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
            ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
              *)&local_138.__align,(opt *)(pRVar10->live_in_)._M_h._M_before_begin._M_nxt,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)0x0,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,
             predicate_03);
  puVar14 = moved_inst;
  MakeFilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
            ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
              *)&local_68.__align,(opt *)0x0,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)0x0,
             (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,
             predicate_03);
  tVar21 = local_68;
  p_Var19 = local_128;
  tVar13._4_4_ = uStack_12c;
  tVar13._0_4_ = uStack_130;
  if (local_138 != local_68 || ((ulong)tStack_60 ^ (ulong)tVar13) != 0) {
    tVar17 = local_138;
    local_68 = (type)l2_sim_result;
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)l2_sim_result,(Instruction **)((long)tVar17 + 8),&local_68);
      if (tVar17 != tVar13) {
        do {
          tVar17.__data = *tVar17.__data;
          if (tVar17 == tVar13) break;
          local_138 = *(type *)((long)tVar17 + 8);
          cVar11 = std::
                   _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(p_Var19,(key_type *)&local_138);
        } while (cVar11.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur !=
                 (__node_type *)0x0);
      }
    } while (tVar17 != tVar21 || ((ulong)tStack_60 ^ (ulong)tVar13) != 0);
  }
  local_68 = (type)&uStack_38;
  tStack_60 = (type)0x1;
  local_58 = (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)0x0;
  uStack_50 = 0;
  local_48 = CONCAT44(local_48._4_4_,0x3f800000);
  local_40 = 0;
  uStack_38 = 0;
  Loop::GetExitBlocks(loop,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                            *)&local_68.__align);
  if (local_58 !=
      (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
       *)0x0) {
    this_00 = &local_1d8->block_pressure_;
    p_Var19 = local_58;
    do {
      local_138._0_4_ = *(undefined4 *)((long)p_Var19 + 8);
      cVar12 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(&this_00->_M_h,(key_type *)local_138.__data);
      puVar14 = (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)((long)cVar12.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                          ._M_cur + 0x10);
      if (cVar12.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
          ._M_cur == (__node_type *)0x0) {
        puVar14 = (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
                   *)0x0;
      }
      local_138 = (type)&l2_sim_result->live_out_;
      for (p_Var16 = (puVar14->_M_h)._M_before_begin._M_nxt; p_Var16 != (_Hash_node_base *)0x0;
          p_Var16 = p_Var16->_M_nxt) {
        std::
        _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                  ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)&l2_sim_result->live_out_,p_Var16 + 1,&local_138);
      }
      p_Var19 = *(_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  **)p_Var19;
    } while (p_Var19 !=
             (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              *)0x0);
  }
  local_1b8 = (type)0x0;
  p_Stack_90 = local_1e0;
  predicate_00.copied_inst =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)local_1e0;
  predicate_00.moved_inst = moved_inst;
  predicate_00.loop = loop;
  local_98 = moved_inst;
  local_88 = loop;
  MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            ((Range *)&local_138.__align,
             (opt *)(l2_sim_result->live_out_)._M_h._M_before_begin._M_nxt,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_1b8.__align,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)puVar14,predicate_00);
  tVar21 = local_110;
  pLVar1 = &l1_sim_result->live_out_;
  local_198 = local_118;
  tVar17._4_4_ = uStack_12c;
  tVar17._0_4_ = uStack_130;
  local_1a8 = local_128;
  uStack_1a0 = uStack_120;
  local_1b8 = local_138;
  uVar20 = local_108 ^ (ulong)tVar17;
  local_200 = (type)pLVar1;
  if (local_138 != local_110 || uVar20 != 0) {
    tVar13 = local_138;
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)pLVar1,(Instruction **)((long)tVar13 + 8),&local_200);
      if (tVar13 != tVar17) {
        do {
          tVar13.__data = *tVar13.__data;
          local_1b8 = tVar13;
          bVar6 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
                  ::IsPredicateSatisfied
                            ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                              *)&local_1b8.__align);
        } while (!bVar6);
      }
    } while (tVar13 != tVar21 || uVar20 != 0);
  }
  local_1b8 = (type)0x0;
  p_Stack_a8 = local_1e0;
  predicate_01.copied_inst =
       (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
        *)local_1e0;
  predicate_01.moved_inst = moved_inst;
  predicate_01.loop = loop;
  local_b0 = moved_inst;
  local_a0 = loop;
  MakeFilterIteratorRange<std::__detail::_Node_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
            ((Range *)&local_138.__align,
             (opt *)(l2_sim_result->live_in_)._M_h._M_before_begin._M_nxt,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)&local_1b8.__align,
             (_Node_iterator<spvtools::opt::Instruction_*,_true,_false> *)puVar14,predicate_01);
  tVar21 = local_110;
  local_198 = local_118;
  tVar5._4_4_ = uStack_12c;
  tVar5._0_4_ = uStack_130;
  local_1a8 = local_128;
  uStack_1a0 = uStack_120;
  local_1b8 = local_138;
  uVar20 = local_108 ^ (ulong)tVar5;
  local_200 = (type)pLVar1;
  tStack_1b0 = tVar5;
  if (local_138 != local_110 || uVar20 != 0) {
    tVar13 = local_138;
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)pLVar1,(Instruction **)((long)tVar13 + 8),&local_200);
      if (tVar13 != tVar5) {
        do {
          tVar13.__data = *tVar13.__data;
          local_1b8 = tVar13;
          bVar6 = FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
                  ::IsPredicateSatisfied
                            ((FilterIterator<std::__detail::_Node_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                              *)&local_1b8.__align);
        } while (!bVar6);
      }
    } while (tVar13 != tVar21 || uVar20 != 0);
  }
  p_Var16 = (l1_sim_result->live_out_)._M_h._M_before_begin._M_nxt;
  local_138 = (type)l2_sim_result;
  if (p_Var16 != (_Hash_node_base *)0x0) {
    do {
      std::
      _Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<spvtools::opt::Instruction*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::Instruction*,false>>>>
                ((_Hashtable<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::allocator<spvtools::opt::Instruction*>,std::__detail::_Identity,std::equal_to<spvtools::opt::Instruction*>,std::hash<spvtools::opt::Instruction*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)l2_sim_result,p_Var16 + 1,&local_138);
      p_Var16 = p_Var16->_M_nxt;
    } while (p_Var16 != (_Hash_node_base *)0x0);
  }
  for (p_Var16 = (l1_sim_result->live_in_)._M_h._M_before_begin._M_nxt;
      p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
    RegionRegisterLiveness::AddRegisterClass(l1_sim_result,(Instruction *)p_Var16[1]._M_nxt);
  }
  for (p_Var16 = (l2_sim_result->live_in_)._M_h._M_before_begin._M_nxt;
      p_Var16 != (_Hash_node_base *)0x0; p_Var16 = p_Var16->_M_nxt) {
    RegionRegisterLiveness::AddRegisterClass(l2_sim_result,(Instruction *)p_Var16[1]._M_nxt);
  }
  l1_sim_result->used_registers_ = 0;
  l2_sim_result->used_registers_ = 0;
  end = (__node_type *)(loop->loop_basic_blocks_)._M_h._M_before_begin._M_nxt;
  if (end != (__node_type *)0x0) {
    local_178 = &(local_1d8->block_pressure_)._M_h;
    do {
      blk_id = *(uint32_t *)
                &(end->super__Hash_node_value<spvtools::opt::Instruction_*,_false>).
                 super__Hash_node_value_base<spvtools::opt::Instruction_*>._M_storage._M_storage;
      this_01 = local_1d8->context_;
      local_170 = end;
      if ((this_01->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
        IRContext::BuildCFG(this_01);
      }
      local_160 = CFG::block((this_01->cfg_)._M_t.
                             super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>
                             .super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl,blk_id
                            );
      local_138._0_4_ = blk_id;
      cVar12 = std::
               _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(local_178,(key_type *)local_138.__data);
      local_158 = cVar12.
                  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                  ._M_cur + 0x10;
      if (cVar12.
          super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_158 = cVar12.
                    super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                    ._M_cur;
        __assert_fail("live_inout != nullptr && \"Basic block not processed\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp"
                      ,0x207,
                      "void spvtools::opt::RegisterLiveness::SimulateFission(const Loop &, const std::unordered_set<Instruction *> &, const std::unordered_set<Instruction *> &, RegionRegisterLiveness *, RegionRegisterLiveness *) const"
                     );
      }
      local_1b8 = (type)0x0;
      p_Stack_c0 = local_1e0;
      predicate_02.copied_inst =
           (unordered_set<spvtools::opt::Instruction_*,_std::hash<spvtools::opt::Instruction_*>,_std::equal_to<spvtools::opt::Instruction_*>,_std::allocator<spvtools::opt::Instruction_*>_>
            *)local_1e0;
      predicate_02.moved_inst = moved_inst;
      predicate_02.loop = loop;
      local_c8 = moved_inst;
      local_b8 = loop;
      MakeFilterIteratorRange<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__0>
                ((Range *)&local_138.__align,
                 *(opt **)((long)cVar12.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                                 ._M_cur + 0x58),
                 (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)
                 &local_1b8.__align,
                 (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)end,predicate_02
                );
      MakeFilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
                ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
                  *)&local_1b8.__align,
                 *(opt **)((long)cVar12.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::RegisterLiveness::RegionRegisterLiveness>,_false>
                                 ._M_cur + 0x58),
                 (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)0x0,
                 (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,
                 predicate_03);
      MakeFilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction*,true,false>,spvtools::opt::RegisterLiveness::SimulateFission(spvtools::opt::Loop_const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,std::unordered_set<spvtools::opt::Instruction*,std::hash<spvtools::opt::Instruction*>,std::equal_to<spvtools::opt::Instruction*>,std::allocator<spvtools::opt::Instruction*>>const&,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*,spvtools::opt::RegisterLiveness::RegionRegisterLiveness*)const::__1>
                ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:459:26)>
                  *)&local_200.__align,(opt *)0x0,
                 (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)0x0,
                 (_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false> *)moved_inst,
                 predicate_03);
      p_Var19 = local_1a8;
      tVar13 = tStack_1b0;
      tVar21 = local_1b8;
      uVar20 = local_1f8;
      local_168 = local_200;
      tStack_1b0._4_4_ = uStack_12c;
      tStack_1b0._0_4_ = uStack_130;
      local_198 = local_118;
      local_1a8 = local_128;
      uStack_1a0 = uStack_120;
      local_148 = tStack_1b0;
      local_150 = local_108 ^ (ulong)tStack_1b0;
      local_1d0 = local_110;
      uVar23 = 0;
      if (local_138 != local_110 || local_150 != 0) {
        uVar23 = 0;
        tVar17 = local_138;
        do {
          if (tVar17 != local_148) {
            do {
              tVar17.__data = *tVar17.__data;
              local_1b8 = tVar17;
              bVar6 = FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:455:26)>
                      ::IsPredicateSatisfied
                                ((FilterIterator<std::__detail::_Node_const_iterator<spvtools::opt::Instruction_*,_true,_false>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_DiligentGraphics[P]DiligentCore_ThirdParty_SPIRV_Tools_source_opt_register_pressure_cpp:455:26)>
                                  *)&local_1b8.__align);
            } while (!bVar6);
          }
          uVar23 = uVar23 + 1;
        } while (tVar17 != local_1d0 || local_150 != 0);
      }
      tVar17 = local_168;
      uVar24 = 0;
      local_1c0 = uVar23;
      if (tVar21 != local_168 || (uVar20 ^ (ulong)tVar13) != 0) {
        do {
          if (tVar21 != tVar13) {
            do {
              tVar21.__data = *tVar21.__data;
              if (tVar21 == tVar13) break;
              local_1b8 = *(type *)((long)tVar21 + 8);
              cVar11 = std::
                       _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(p_Var19,(key_type *)&local_1b8);
            } while (cVar11.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur !=
                     (__node_type *)0x0);
          }
          uVar24 = uVar24 + 1;
        } while (tVar21 != tVar17 || (uVar20 ^ (ulong)tVar13) != 0);
      }
      local_1b8 = (type)auStack_188;
      tStack_1b0 = (type)0x1;
      local_1a8 = (_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)0x0;
      uStack_1a0 = 0;
      local_198 = CONCAT44(local_198._4_4_,0x3f800000);
      local_190 = 0;
      auStack_188[0] = 0;
      pIVar18 = &(local_160->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
      pIVar2 = (local_160->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      local_1c8 = uVar24;
      while ((pIVar18 != pIVar2 &&
             (tVar21 = (type)(pIVar18->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                             previous_node_,
             *(Op *)&((_Prime_rehash_policy *)((long)tVar21 + 0x20))->_M_next_resize != OpPhi))) {
        local_200 = tVar21;
        cVar11 = std::
                 _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&moved_inst->_M_h,(key_type *)&local_200);
        bVar6 = true;
        if ((cVar11.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ==
             (__node_type *)0x0) &&
           (cVar11 = std::
                     _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find(local_1e0,(key_type *)&local_200),
           cVar11.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ==
           (__node_type *)0x0)) {
          bVar6 = Loop::IsInsideLoop(loop,(Instruction *)local_200);
          bVar6 = !bVar6;
        }
        local_200 = tVar21;
        tVar13.__align =
             (anon_struct_8_0_00000001_for___align)
             std::
             _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&moved_inst->_M_h,(key_type *)&local_200);
        local_e0 = 0;
        local_e8 = (long *)operator_new(0x30);
        *local_e8 = (long)local_158._M_cur;
        local_e8[1] = (long)&local_1b8;
        local_e8[2] = (long)&local_1c0;
        local_e8[3] = (long)&local_1c8;
        *(bool *)(local_e8 + 4) = bVar6;
        *(bool *)((long)local_e8 + 0x21) = tVar13 == (type)0x0;
        local_e8[5] = (long)local_1d8;
        local_d0 = std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:540:24)>
                   ::_M_invoke;
        local_d8 = std::
                   _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/register_pressure.cpp:540:24)>
                   ::_M_manager;
        local_1f8 = 0;
        local_200 = (type)&local_e8;
        local_1e8 = std::
                    _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                    ::_M_invoke;
        local_1f0 = std::
                    _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h:830:17)>
                    ::_M_manager;
        pOVar22 = (pointer)(((LiveSet *)((long)tVar21 + 0x38))->_M_h)._M_buckets;
        pOVar3 = *(pointer *)((long)tVar21 + 0x40);
        local_1d0.__align = tVar13.__align;
        if (pOVar22 == pOVar3) {
LAB_005fe895:
          (*local_1f0)(&local_200,&local_200,3);
        }
        else {
          do {
            bVar7 = spvIsInIdType(pOVar22->type);
            if (bVar7) {
              ppuVar4 = (uint **)(pOVar22->words).large_data_._M_t.
                                 super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                                 ._M_head_impl;
              ppuVar15 = &(pOVar22->words).small_data_;
              if (ppuVar4 != (uint **)0x0) {
                ppuVar15 = ppuVar4;
              }
              local_140._M_nxt = (_Hash_node_base *)*ppuVar15;
              if (local_1f0 == (code *)0x0) {
                std::__throw_bad_function_call();
              }
              cVar8 = (*local_1e8)(&local_200,&local_140);
              if (cVar8 == '\0') break;
            }
            pOVar22 = pOVar22 + 1;
          } while (pOVar22 != pOVar3);
          if (local_1f0 != (code *)0x0) goto LAB_005fe895;
        }
        if (local_d8 != (code *)0x0) {
          (*local_d8)(&local_e8,&local_e8,3);
        }
        uVar20 = local_1c0;
        if (local_1c0 < l1_sim_result->used_registers_) {
          uVar20 = l1_sim_result->used_registers_;
        }
        l1_sim_result->used_registers_ = uVar20;
        uVar20 = local_1c8;
        if (local_1c8 < l2_sim_result->used_registers_) {
          uVar20 = l2_sim_result->used_registers_;
        }
        l2_sim_result->used_registers_ = uVar20;
        if ((((*(bool *)((long)&((_Prime_rehash_policy *)((long)tVar21 + 0x20))->_M_next_resize + 5)
               == true) &&
             (opcode = *(Op *)&((_Prime_rehash_policy *)((long)tVar21 + 0x20))->_M_next_resize,
             opcode != OpUndef)) && (iVar9 = spvOpcodeIsConstant(opcode), iVar9 == 0)) &&
           (*(Op *)&((_Prime_rehash_policy *)((long)tVar21 + 0x20))->_M_next_resize != OpLabel)) {
          if (bVar6 != false) {
            local_200 = tVar21;
            cVar11 = std::
                     _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)l1_sim_result,(key_type *)&local_200);
            if (cVar11.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ==
                (__node_type *)0x0) {
              RegionRegisterLiveness::AddRegisterClass(l1_sim_result,(Instruction *)tVar21);
            }
            local_1c0 = local_1c0 - 1;
          }
          if (local_1d0 == (type)0x0) {
            local_200 = tVar21;
            cVar11 = std::
                     _Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::find((_Hashtable<spvtools::opt::Instruction_*,_spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::Instruction_*>,_std::hash<spvtools::opt::Instruction_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                             *)l2_sim_result,(key_type *)&local_200);
            if (cVar11.super__Node_iterator_base<spvtools::opt::Instruction_*,_false>._M_cur ==
                (__node_type *)0x0) {
              RegionRegisterLiveness::AddRegisterClass(l2_sim_result,(Instruction *)tVar21);
            }
            local_1c8 = local_1c8 - 1;
          }
        }
        pIVar18 = (pIVar18->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)&local_1b8.__align);
      end = ((_Node_iterator_base<spvtools::opt::Instruction_*,_false> *)
            &local_170->super__Hash_node_base)->_M_cur;
    } while (end != (__node_type *)0x0);
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_68.__align);
  return;
}

Assistant:

void RegisterLiveness::SimulateFission(
    const Loop& loop, const std::unordered_set<Instruction*>& moved_inst,
    const std::unordered_set<Instruction*>& copied_inst,
    RegionRegisterLiveness* l1_sim_result,
    RegionRegisterLiveness* l2_sim_result) const {
  l1_sim_result->Clear();
  l2_sim_result->Clear();

  // Filter predicates: consider instructions that only belong to the first and
  // second loop.
  auto belong_to_loop1 = [&moved_inst, &copied_inst, &loop](Instruction* insn) {
    return moved_inst.count(insn) || copied_inst.count(insn) ||
           !loop.IsInsideLoop(insn);
  };
  auto belong_to_loop2 = [&moved_inst](Instruction* insn) {
    return !moved_inst.count(insn);
  };

  const RegionRegisterLiveness* header_live_inout = Get(loop.GetHeaderBlock());
  // l1 live-in
  {
    auto live_loop = MakeFilterIteratorRange(
        header_live_inout->live_in_.begin(), header_live_inout->live_in_.end(),
        belong_to_loop1);
    l1_sim_result->live_in_.insert(live_loop.begin(), live_loop.end());
  }
  // l2 live-in
  {
    auto live_loop = MakeFilterIteratorRange(
        header_live_inout->live_in_.begin(), header_live_inout->live_in_.end(),
        belong_to_loop2);
    l2_sim_result->live_in_.insert(live_loop.begin(), live_loop.end());
  }

  std::unordered_set<uint32_t> exit_blocks;
  loop.GetExitBlocks(&exit_blocks);

  // l2 live-out.
  for (uint32_t bb_id : exit_blocks) {
    const RegionRegisterLiveness* live_inout = Get(bb_id);
    l2_sim_result->live_out_.insert(live_inout->live_in_.begin(),
                                    live_inout->live_in_.end());
  }
  // l1 live-out.
  {
    auto live_out = MakeFilterIteratorRange(l2_sim_result->live_out_.begin(),
                                            l2_sim_result->live_out_.end(),
                                            belong_to_loop1);
    l1_sim_result->live_out_.insert(live_out.begin(), live_out.end());
  }
  {
    auto live_out =
        MakeFilterIteratorRange(l2_sim_result->live_in_.begin(),
                                l2_sim_result->live_in_.end(), belong_to_loop1);
    l1_sim_result->live_out_.insert(live_out.begin(), live_out.end());
  }
  // Lives out of l1 are live out of l2 so are live in of l2 as well.
  l2_sim_result->live_in_.insert(l1_sim_result->live_out_.begin(),
                                 l1_sim_result->live_out_.end());

  for (Instruction* insn : l1_sim_result->live_in_) {
    l1_sim_result->AddRegisterClass(insn);
  }
  for (Instruction* insn : l2_sim_result->live_in_) {
    l2_sim_result->AddRegisterClass(insn);
  }

  l1_sim_result->used_registers_ = 0;
  l2_sim_result->used_registers_ = 0;

  for (uint32_t bb_id : loop.GetBlocks()) {
    BasicBlock* bb = context_->cfg()->block(bb_id);

    const RegisterLiveness::RegionRegisterLiveness* live_inout = Get(bb_id);
    assert(live_inout != nullptr && "Basic block not processed");
    auto l1_block_live_out =
        MakeFilterIteratorRange(live_inout->live_out_.begin(),
                                live_inout->live_out_.end(), belong_to_loop1);
    auto l2_block_live_out =
        MakeFilterIteratorRange(live_inout->live_out_.begin(),
                                live_inout->live_out_.end(), belong_to_loop2);

    size_t l1_reg_count =
        std::distance(l1_block_live_out.begin(), l1_block_live_out.end());
    size_t l2_reg_count =
        std::distance(l2_block_live_out.begin(), l2_block_live_out.end());

    std::unordered_set<uint32_t> die_in_block;
    for (Instruction& insn : make_range(bb->rbegin(), bb->rend())) {
      if (insn.opcode() == spv::Op::OpPhi) {
        break;
      }

      bool does_belong_to_loop1 = belong_to_loop1(&insn);
      bool does_belong_to_loop2 = belong_to_loop2(&insn);
      insn.ForEachInId([live_inout, &die_in_block, &l1_reg_count, &l2_reg_count,
                        does_belong_to_loop1, does_belong_to_loop2,
                        this](uint32_t* id) {
        Instruction* op_insn = context_->get_def_use_mgr()->GetDef(*id);
        if (!CreatesRegisterUsage(op_insn) ||
            live_inout->live_out_.count(op_insn)) {
          // already taken into account.
          return;
        }
        if (!die_in_block.count(*id)) {
          if (does_belong_to_loop1) {
            l1_reg_count++;
          }
          if (does_belong_to_loop2) {
            l2_reg_count++;
          }
          die_in_block.insert(*id);
        }
      });
      l1_sim_result->used_registers_ =
          std::max(l1_sim_result->used_registers_, l1_reg_count);
      l2_sim_result->used_registers_ =
          std::max(l2_sim_result->used_registers_, l2_reg_count);
      if (CreatesRegisterUsage(&insn)) {
        if (does_belong_to_loop1) {
          if (!l1_sim_result->live_in_.count(&insn)) {
            l1_sim_result->AddRegisterClass(&insn);
          }
          l1_reg_count--;
        }
        if (does_belong_to_loop2) {
          if (!l2_sim_result->live_in_.count(&insn)) {
            l2_sim_result->AddRegisterClass(&insn);
          }
          l2_reg_count--;
        }
      }
    }
  }
}